

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O1

Am_Wrapper * Am_Get_Owners_Command_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object command;
  Am_Value v;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Value local_18;
  
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  local_38.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)self,10);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&local_28,10);
  in_value = Am_Object::Get(&local_20,0xc5,1);
  Am_Value::operator=(&local_18,in_value);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_28);
  bVar1 = Am_Value::Valid(&local_18);
  if (bVar1 && local_18.type == 0xa001) {
    Am_Object::operator=(&local_38,&local_18);
    Am_Object::Am_Object(&local_30,&Am_Command);
    bVar1 = Am_Object::Is_Instance_Of(&local_38,&local_30);
    Am_Object::~Am_Object(&local_30);
    if (!bVar1) {
      Am_Object::operator=(&local_38,&Am_No_Object);
    }
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
  Am_Object::~Am_Object(&local_38);
  Am_Value::~Am_Value(&local_18);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(Am_Get_Owners_Command)
{
  //owner is inter, owner of inter is widget, get command from widget
  Am_Value v;
  Am_Object command;
  v = self.Get_Owner().Get_Owner().Peek(Am_COMMAND);
  if (v.Valid() && v.type == Am_OBJECT) {
    command = v;
    if (!command.Is_Instance_Of(Am_Command))
      command = Am_No_Object;
  }
  return command;
}